

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayUsageTests::init
          (SingleVertexArrayUsageTests *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  Context *context;
  _Alloc_hider name;
  undefined8 in_RAX;
  TestCaseGroup *this_00;
  undefined8 extraout_RAX;
  Usage usage;
  Usage usage_00;
  long lVar2;
  string local_70;
  string local_50;
  
  for (lVar2 = 0; lVar2 != 0x24; lVar2 = lVar2 + 4) {
    this_00 = (TestCaseGroup *)operator_new(0x80);
    context = (this->super_TestCaseGroup).m_context;
    uVar1 = *(uint *)((long)&DAT_00a0b240 + lVar2);
    deqp::gls::Array::usageTypeToString_abi_cxx11_(&local_50,(Array *)(ulong)uVar1,usage);
    name._M_p = local_50._M_dataplus._M_p;
    deqp::gls::Array::usageTypeToString_abi_cxx11_(&local_70,(Array *)(ulong)uVar1,usage_00);
    TestCaseGroup::TestCaseGroup(this_00,context,name._M_p,local_70._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    (this_00->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_00c2da50;
    *(uint *)&this_00[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    in_RAX = extraout_RAX;
  }
  return (int)in_RAX;
}

Assistant:

void SingleVertexArrayUsageTests::init (void)
{
	// Test usage
	Array::Usage		usages[]		= { Array::USAGE_STATIC_DRAW, Array::USAGE_STREAM_DRAW, Array::USAGE_DYNAMIC_DRAW, Array::USAGE_STATIC_COPY, Array::USAGE_STREAM_COPY, Array::USAGE_DYNAMIC_COPY, Array::USAGE_STATIC_READ, Array::USAGE_STREAM_READ, Array::USAGE_DYNAMIC_READ };
	for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usages); usageNdx++)
	{
		addChild(new SingleVertexArrayUsageGroup(m_context, usages[usageNdx]));
	}
}